

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

libdeflate_result
dispatch_decomp(libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,
               size_t out_nbytes_avail,size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  libdeflate_result lVar1;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  libdeflate_decompressor *in_RDI;
  size_t in_R8;
  size_t *in_R9;
  size_t *in_stack_00000008;
  decompress_func_t f;
  decompress_func_t local_38;
  
  local_38 = arch_select_decompress_func();
  if (local_38 == (decompress_func_t)0x0) {
    local_38 = deflate_decompress_default;
  }
  decompress_impl = local_38;
  lVar1 = (*local_38)(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  return lVar1;
}

Assistant:

static enum libdeflate_result
dispatch_decomp(struct libdeflate_decompressor *d,
		const void *in, size_t in_nbytes,
		void *out, size_t out_nbytes_avail,
		size_t *actual_in_nbytes_ret, size_t *actual_out_nbytes_ret)
{
	decompress_func_t f = arch_select_decompress_func();

	if (f == NULL)
		f = DEFAULT_IMPL;

	decompress_impl = f;
	return f(d, in, in_nbytes, out, out_nbytes_avail,
		 actual_in_nbytes_ret, actual_out_nbytes_ret);
}